

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O0

void __thiscall dg::AllMaxPath::compute(AllMaxPath *this,CDGraph *graph,CDNode *target)

{
  bool bVar1;
  EdgesT *this_00;
  size_type sVar2;
  mapped_type *pmVar3;
  reference ppCVar4;
  CDGraph *what;
  CDNode *in_RDX;
  mapped_type *D;
  CDNode *pred;
  const_iterator __end3;
  const_iterator __begin3;
  EdgesT *__range3;
  CDNode *node;
  QueueLIFO<dg::CDNode_*> queue;
  ContainedType *nd;
  node_iterator __end2;
  node_iterator __begin2;
  CDGraph *__range2;
  CDGraph *in_stack_ffffffffffffff28;
  unordered_map<dg::CDNode_*,_dg::AllMaxPath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>_>
  *in_stack_ffffffffffffff30;
  unsigned_long in_stack_ffffffffffffff48;
  CDGraph *i;
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
  *in_stack_ffffffffffffff50;
  CDNode *this_01;
  __normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
  local_a0;
  EdgesT *local_98;
  CDNode *local_90;
  ContainedType *local_38;
  iterator local_30;
  iterator local_28 [2];
  CDNode *local_18;
  
  local_18 = in_RDX;
  local_28[0]._M_current =
       (unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_> *)
       CDGraph::begin(in_stack_ffffffffffffff28);
  local_30._M_current =
       (unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_> *)
       CDGraph::end(in_stack_ffffffffffffff28);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                             *)in_stack_ffffffffffffff30,
                            (__normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
                             *)in_stack_ffffffffffffff28), bVar1) {
    local_38 = CDGraph::node_iterator::operator*((node_iterator *)0x15b1ce);
    this_00 = ElemWithEdges<dg::CDNode>::successors(&local_38->super_ElemWithEdges<dg::CDNode>);
    sVar2 = std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::size(this_00);
    pmVar3 = std::
             unordered_map<dg::CDNode_*,_dg::AllMaxPath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>_>
             ::operator[](in_stack_ffffffffffffff30,(key_type *)in_stack_ffffffffffffff28);
    pmVar3->counter = (unsigned_short)sVar2;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_*,_std::vector<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>_>
    ::operator++(local_28);
  }
  pmVar3 = std::
           unordered_map<dg::CDNode_*,_dg::AllMaxPath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>_>
           ::operator[](in_stack_ffffffffffffff30,(key_type *)in_stack_ffffffffffffff28);
  CDNode::getID(local_18);
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
  ::set(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  ADT::QueueLIFO<dg::CDNode_*>::QueueLIFO((QueueLIFO<dg::CDNode_*> *)0x15b256);
  ADT::QueueLIFO<dg::CDNode_*>::push
            ((QueueLIFO<dg::CDNode_*> *)pmVar3,(CDNode **)in_stack_ffffffffffffff28);
  while (bVar1 = ADT::QueueLIFO<dg::CDNode_*>::empty((QueueLIFO<dg::CDNode_*> *)0x15b272),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_90 = ADT::QueueLIFO<dg::CDNode_*>::pop((QueueLIFO<dg::CDNode_*> *)pmVar3);
    local_98 = ElemWithEdges<dg::CDNode>::predecessors(&local_90->super_ElemWithEdges<dg::CDNode>);
    local_a0._M_current =
         (CDNode **)
         std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::begin
                   ((vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_> *)in_stack_ffffffffffffff28
                   );
    std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::end
              ((vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_> *)in_stack_ffffffffffffff28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
                               *)pmVar3,
                              (__normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
                               *)in_stack_ffffffffffffff28), bVar1) {
      ppCVar4 = __gnu_cxx::
                __normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
                ::operator*(&local_a0);
      this_01 = *ppCVar4;
      what = (CDGraph *)
             std::
             unordered_map<dg::CDNode_*,_dg::AllMaxPath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>_>
             ::operator[]((unordered_map<dg::CDNode_*,_dg::AllMaxPath::Info,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>_>
                           *)pmVar3,(key_type *)in_stack_ffffffffffffff28);
      *(short *)&(what->_nodes).
                 super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage =
           *(short *)&(what->_nodes).
                      super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + -1;
      if (*(short *)&(what->_nodes).
                     super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
        i = what;
        CDNode::getID(local_18);
        ADT::
        SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
        ::set((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
               *)this_01,(unsigned_long)i);
        ADT::QueueLIFO<dg::CDNode_*>::push((QueueLIFO<dg::CDNode_*> *)pmVar3,(CDNode **)what);
        in_stack_ffffffffffffff28 = what;
      }
      __gnu_cxx::
      __normal_iterator<dg::CDNode_*const_*,_std::vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>_>
      ::operator++(&local_a0);
    }
  }
  ADT::QueueLIFO<dg::CDNode_*>::~QueueLIFO((QueueLIFO<dg::CDNode_*> *)0x15b368);
  return;
}

Assistant:

void compute(CDGraph &graph, CDNode *target) {
        // initialize nodes
        for (auto *nd : graph) {
            data[nd].counter = nd->successors().size();
        }

        // initialize the search
        data[target].colors.set(target->getID());
        ADT::QueueLIFO<CDNode *> queue;
        queue.push(target);

        // search!
        while (!queue.empty()) {
            auto *node = queue.pop();
            assert(data[node].colors.get(target->getID()) &&
                   "A non-colored node in queue");

            for (auto *pred : node->predecessors()) {
                auto &D = data[pred];
                --D.counter;
                if (D.counter == 0) {
                    D.colors.set(target->getID());
                    queue.push(pred);
                }
            }
        }
    }